

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O0

void deqp::gles31::Functional::anon_unknown_0::generateBufferBackedInterfaceResourceBasicBlockTypes
               (Context *context,TestCaseGroup *targetGroup,GLSLVersion glslVersion,Storage storage,
               _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
               *blockContentGenerator)

{
  Program *this;
  Shader *this_00;
  Node *ptr;
  StorageQualifier *this_01;
  LayoutQualifier *this_02;
  InterfaceBlock *pIVar1;
  Variable *pVVar2;
  ArrayElement *pAVar3;
  undefined1 local_140 [8];
  SharedPtr dummyVariable_3;
  SharedPtr block_3;
  SharedPtr arrayElement_1;
  SharedPtr dummyVariable_2;
  SharedPtr block_2;
  SharedPtr arrayElement;
  SharedPtr dummyVariable_1;
  SharedPtr block_1;
  SharedPtr dummyVariable;
  SharedPtr block;
  ProgramInterface programInterface;
  undefined1 local_88 [8];
  SharedPtr binding;
  SharedPtr storageQualifier;
  SharedPtr defaultBlock;
  SharedPtr shader;
  undefined1 local_38 [8];
  SharedPtr program;
  _func_void_Context_ptr_SharedPtr_ptr_TestCaseGroup_ptr_ProgramInterface_char_ptr
  *blockContentGenerator_local;
  Storage storage_local;
  GLSLVersion glslVersion_local;
  TestCaseGroup *targetGroup_local;
  Context *context_local;
  
  program.m_state = (SharedPtrStateBase *)blockContentGenerator;
  this = (Program *)operator_new(0x28);
  ResourceDefinition::Program::Program(this,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_38,(Node *)this);
  this_00 = (Shader *)operator_new(0x28);
  ResourceDefinition::Shader::Shader(this_00,(SharedPtr *)local_38,SHADERTYPE_COMPUTE,glslVersion);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&defaultBlock.m_state,(Node *)this_00);
  ptr = (Node *)operator_new(0x20);
  ResourceDefinition::DefaultBlock::DefaultBlock
            ((DefaultBlock *)ptr,(SharedPtr *)&defaultBlock.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&storageQualifier.m_state,ptr);
  this_01 = (StorageQualifier *)operator_new(0x28);
  ResourceDefinition::StorageQualifier::StorageQualifier
            (this_01,(SharedPtr *)&storageQualifier.m_state,storage);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&binding.m_state,(Node *)this_01);
  this_02 = (LayoutQualifier *)operator_new(0x38);
  glu::Layout::Layout((Layout *)((long)&block.m_state + 4),-1,1,-1,FORMATLAYOUT_LAST,
                      MATRIXORDER_LAST);
  ResourceDefinition::LayoutQualifier::LayoutQualifier
            (this_02,(SharedPtr *)&binding.m_state,(Layout *)((long)&block.m_state + 4));
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_88,(Node *)this_02);
  block.m_state._0_4_ = 7;
  if (storage == STORAGE_UNIFORM) {
    block.m_state._0_4_ = 1;
  }
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,(SharedPtr *)local_88,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&dummyVariable.m_state,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable(pVVar2,(SharedPtr *)&dummyVariable.m_state,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&block_1.m_state,(Node *)pVVar2);
  (*(code *)program.m_state)(context,&block_1.m_state,targetGroup,block.m_state._0_4_,"named_block")
  ;
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&block_1.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&dummyVariable.m_state);
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,(SharedPtr *)local_88,false);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&dummyVariable_1.m_state,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable
            (pVVar2,(SharedPtr *)&dummyVariable_1.m_state,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&arrayElement.m_state,(Node *)pVVar2);
  (*(code *)program.m_state)
            (context,&arrayElement.m_state,targetGroup,block.m_state._0_4_,"unnamed_block");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&arrayElement.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&dummyVariable_1.m_state);
  pAVar3 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar3,(SharedPtr *)local_88,3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&block_2.m_state,(Node *)pAVar3);
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,(SharedPtr *)&block_2.m_state,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&dummyVariable_2.m_state,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable
            (pVVar2,(SharedPtr *)&dummyVariable_2.m_state,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&arrayElement_1.m_state,(Node *)pVVar2);
  (*(code *)program.m_state)
            (context,&arrayElement_1.m_state,targetGroup,block.m_state._0_4_,"block_array");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&arrayElement_1.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&dummyVariable_2.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&block_2.m_state);
  pAVar3 = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(pAVar3,(SharedPtr *)local_88,1);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&block_3.m_state,(Node *)pAVar3);
  pIVar1 = (InterfaceBlock *)operator_new(0x28);
  ResourceDefinition::InterfaceBlock::InterfaceBlock(pIVar1,(SharedPtr *)&block_3.m_state,true);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)&dummyVariable_3.m_state,(Node *)pIVar1);
  pVVar2 = (Variable *)operator_new(0x28);
  ResourceDefinition::Variable::Variable
            (pVVar2,(SharedPtr *)&dummyVariable_3.m_state,TYPE_BOOL_VEC3);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
             *)local_140,(Node *)pVVar2);
  (*(code *)program.m_state)
            (context,local_140,targetGroup,block.m_state._0_4_,"block_array_single_element");
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_140);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&dummyVariable_3.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&block_3.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_88);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&binding.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&storageQualifier.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)&defaultBlock.m_state);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr((SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>
              *)local_38);
  return;
}

Assistant:

static void generateBufferBackedInterfaceResourceBasicBlockTypes (Context& context, tcu::TestCaseGroup* targetGroup, glu::GLSLVersion glslVersion, glu::Storage storage, void (*blockContentGenerator)(Context&, const ResourceDefinition::Node::SharedPtr&, tcu::TestCaseGroup* const, ProgramInterface interface, const char* blockName))
{
	const ResourceDefinition::Node::SharedPtr	program				(new ResourceDefinition::Program());
	const ResourceDefinition::Node::SharedPtr	shader				(new ResourceDefinition::Shader(program, glu::SHADERTYPE_COMPUTE, glslVersion));
	const ResourceDefinition::Node::SharedPtr	defaultBlock		(new ResourceDefinition::DefaultBlock(shader));
	const ResourceDefinition::Node::SharedPtr	storageQualifier	(new ResourceDefinition::StorageQualifier(defaultBlock, storage));
	const ResourceDefinition::Node::SharedPtr	binding				(new ResourceDefinition::LayoutQualifier(storageQualifier, glu::Layout(-1, 1)));
	const ProgramInterface						programInterface	= (storage == glu::STORAGE_UNIFORM) ? (PROGRAMINTERFACE_UNIFORM_BLOCK) : (PROGRAMINTERFACE_SHADER_STORAGE_BLOCK);

	// .named_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(binding, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "named_block");
	}

	// .unnamed_block
	{
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(binding, false));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "unnamed_block");
	}

	// .block_array
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(binding, 3));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "block_array");
	}

	// .block_array_single_element
	{
		const ResourceDefinition::Node::SharedPtr arrayElement	(new ResourceDefinition::ArrayElement(binding, 1));
		const ResourceDefinition::Node::SharedPtr block			(new ResourceDefinition::InterfaceBlock(arrayElement, true));
		const ResourceDefinition::Node::SharedPtr dummyVariable	(new ResourceDefinition::Variable(block, glu::TYPE_BOOL_VEC3));

		blockContentGenerator(context, dummyVariable, targetGroup, programInterface, "block_array_single_element");
	}
}